

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

uint fts5HashKey2(int nSlot,u8 b,u8 *p,int n)

{
  uint local_24;
  int local_20;
  uint h;
  int i;
  int n_local;
  u8 *p_local;
  u8 b_local;
  int nSlot_local;
  
  local_24 = 0xd;
  for (local_20 = n + -1; -1 < local_20; local_20 = local_20 + -1) {
    local_24 = local_24 << 3 ^ local_24 ^ (uint)p[local_20];
  }
  return (local_24 << 3 ^ local_24 ^ (uint)b) % (uint)nSlot;
}

Assistant:

static unsigned int fts5HashKey2(int nSlot, u8 b, const u8 *p, int n){
  int i;
  unsigned int h = 13;
  for(i=n-1; i>=0; i--){
    h = (h << 3) ^ h ^ p[i];
  }
  h = (h << 3) ^ h ^ b;
  return (h % nSlot);
}